

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void ot::commissioner::from_json(Json *aJson,ActiveOperationalDataset *aDataset)

{
  byte *pbVar1;
  pointer puVar2;
  undefined4 uVar3;
  bool bVar4;
  const_reference pvVar5;
  JsonException *pJVar6;
  Timestamp ret;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  key_type local_d8;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_b8;
  Error local_a0;
  Error local_78;
  Error local_50;
  
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])0x2e2413);
  if (bVar4) {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ActiveTimestamp","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_100);
    nlohmann::detail::from_json_fn::operator()
              ((from_json_fn *)
               &nlohmann::detail::static_const<nlohmann::detail::from_json_fn>::value,pvVar5,
               (Timestamp *)&local_d8);
    aDataset->mActiveTimestamp = (Timestamp)local_d8._M_dataplus._M_p;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])0x2e24db);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"NetworkName","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,pvVar5
              );
    std::__cxx11::string::operator=((string *)&aDataset->mNetworkName,(string *)local_100);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[8],_0>(aJson,(char (*) [8])0x2e2426);
  if (bVar4) {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Channel","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_100);
    nlohmann::detail::from_json_fn::operator()
              ((from_json_fn *)
               &nlohmann::detail::static_const<nlohmann::detail::from_json_fn>::value,pvVar5,
               (Channel *)&local_d8);
    aDataset->mChannel = local_d8._M_dataplus._M_p._0_4_;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])0x2e243c);
  if (bVar4) {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ChannelMask","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_100);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>,_0>
              (&local_b8,pvVar5);
    local_d8.field_2._M_allocated_capacity =
         (size_type)
         (aDataset->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8._M_dataplus._M_p =
         (pointer)(aDataset->mChannelMask).
                  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_d8._M_string_length =
         (size_type)
         (aDataset->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
               *)&local_d8);
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_b8);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])0x2e245a);
  if (bVar4) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"ExtendedPanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_d8,pvVar5);
    utils::Hex((Error *)local_100,&aDataset->mExtendedPanId,&local_d8);
    uVar3 = local_100._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._8_8_ != &local_e8) {
      operator_delete((void *)local_100._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (uVar3 != kNone) {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"ExtendedPanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 pvVar5);
      utils::Hex(&local_50,&aDataset->mExtendedPanId,(string *)local_100);
      JsonException::JsonException(pJVar6,&local_50);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(aJson,(char (*) [6])0x2e2462);
  if (bVar4) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"PanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_d8,pvVar5);
    utils::ParseInteger<unsigned_short>((Error *)local_100,&aDataset->mPanId,&local_d8);
    uVar3 = local_100._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._8_8_ != &local_e8) {
      operator_delete((void *)local_100._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (uVar3 != kNone) {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"PanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 pvVar5);
      utils::ParseInteger<unsigned_short>(&local_78,&aDataset->mPanId,(string *)local_100);
      JsonException::JsonException(pJVar6,&local_78);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])0x2e247c);
  if (bVar4) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"MeshLocalPrefix");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_d8,pvVar5);
    Ipv6PrefixFromString((Error *)local_100,&aDataset->mMeshLocalPrefix,&local_d8);
    uVar3 = local_100._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._8_8_ != &local_e8) {
      operator_delete((void *)local_100._8_8_);
    }
    if (uVar3 != kNone) {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x38);
      Ipv6PrefixFromString(&local_a0,&aDataset->mMeshLocalPrefix,&local_d8);
      JsonException::JsonException(pJVar6,&local_a0);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[17],_0>(aJson,(char (*) [17])0x2e24b3);
  if (bVar4) {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"NetworkMasterKey","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_100);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,pvVar5);
    puVar2 = (aDataset->mNetworkMasterKey).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._M_dataplus._M_p;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_string_length;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_d8.field_2._M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
      if ((Timestamp)local_d8._M_dataplus._M_p != (Timestamp)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])0x2e250b);
  if (bVar4) {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"PSKc","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_100);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,pvVar5);
    puVar2 = (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d8._M_dataplus._M_p;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_d8._M_string_length;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.field_2._M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
      if ((Timestamp)local_d8._M_dataplus._M_p != (Timestamp)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    *(byte *)&aDataset->mPresentFlags = (byte)aDataset->mPresentFlags | 0x80;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[15],_0>(aJson,(char (*) [15])0x2e251b);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"SecurityPolicy","");
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::SecurityPolicy,_ot::commissioner::SecurityPolicy,_0>
              ((SecurityPolicy *)local_100,pvVar5);
    (aDataset->mSecurityPolicy).mRotationTime = local_100._0_2_;
    puVar2 = (aDataset->mSecurityPolicy).mFlags.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_100._8_8_;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_100._16_8_;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._0_8_;
    local_100._8_8_ = (pointer)0x0;
    local_100._16_8_ = 0;
    local_e8._0_8_ = 0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
      if ((pointer)local_100._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_100._8_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    *(byte *)&aDataset->mPresentFlags = (byte)aDataset->mPresentFlags | 0x40;
  }
  return;
}

Assistant:

static void from_json(const Json &aJson, ActiveOperationalDataset &aDataset)
{
#define SET_IF_PRESENT(name)                                                  \
    if (aJson.contains(#name))                                                \
    {                                                                         \
        aDataset.m##name = aJson.at(#name).get<decltype(aDataset.m##name)>(); \
        aDataset.mPresentFlags |= ActiveOperationalDataset::k##name##Bit;     \
    };

    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(NetworkName);
    SET_IF_PRESENT(Channel);
    SET_IF_PRESENT(ChannelMask);

    if (aJson.contains("ExtendedPanId"))
    {
        SuccessOrThrow(utils::Hex(aDataset.mExtendedPanId, aJson["ExtendedPanId"]));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kExtendedPanIdBit;
    }

    if (aJson.contains("PanId"))
    {
        SuccessOrThrow(utils::ParseInteger(aDataset.mPanId, aJson["PanId"]));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kPanIdBit;
    }

    if (aJson.contains("MeshLocalPrefix"))
    {
        std::string prefix = aJson["MeshLocalPrefix"];

        SuccessOrThrow(Ipv6PrefixFromString(aDataset.mMeshLocalPrefix, prefix));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kMeshLocalPrefixBit;
    };

    SET_IF_PRESENT(NetworkMasterKey);
    SET_IF_PRESENT(PSKc);
    SET_IF_PRESENT(SecurityPolicy);

#undef SET_IF_PRESENT
}